

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::setCharFormat
          (QTextDocumentPrivate *this,int pos,int length,QTextCharFormat *newFormat,
          FormatChangeMode mode)

{
  FragmentMap *this_00;
  QTextFormatCollection *this_01;
  QTextFragmentData *pQVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint k;
  int iVar8;
  long in_FS_OFFSET;
  int local_b8;
  undefined1 local_78 [16];
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 local_68;
  quint32 qStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  totally_ordered_wrapper<QTextFormatPrivate_*> local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  QExplicitlySharedDataPointer<QFontPrivate> local_38;
  
  local_38.d.ptr = *(totally_ordered_wrapper<QFontPrivate_*> *)(in_FS_OFFSET + 0x28);
  beginEditBlock(this);
  if (mode == SetFormatAndPreserveObjectIndices) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
    QTextFormat::clearProperty((QTextFormat *)local_78,0);
    local_b8 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
  }
  else if (mode == SetFormat) {
    local_b8 = QTextFormatCollection::indexForFormat(&this->formats,&newFormat->super_QTextFormat);
  }
  else {
    local_b8 = -1;
  }
  if (pos != -1) goto LAB_004606a7;
  if (mode == MergeFormat) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::format((QTextFormatCollection *)local_78,(int)&this->formats);
    QTextFormat::merge((QTextFormat *)local_78,&newFormat->super_QTextFormat);
    iVar3 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
    this->initialBlockCharFormatIndex = iVar3;
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
  }
  else {
    if (mode == SetFormatAndPreserveObjectIndices) {
      iVar8 = (int)&this->formats;
      QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar8);
      iVar3 = QTextFormat::objectIndex((QTextFormat *)local_78);
      QTextFormat::~QTextFormat((QTextFormat *)local_78);
      if (iVar3 != -1) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar8);
        iVar3 = QTextFormat::objectIndex((QTextFormat *)&stack0xffffffffffffffb8);
        QTextFormat::setObjectIndex((QTextFormat *)local_78,iVar3);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar3 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_78);
        this->initialBlockCharFormatIndex = iVar3;
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
        goto LAB_004606a1;
      }
    }
    this->initialBlockCharFormatIndex = local_b8;
  }
LAB_004606a1:
  length = length + -1;
  pos = 0;
LAB_004606a7:
  iVar3 = pos + length;
  split(this,pos);
  split(this,iVar3);
  this_00 = &this->fragments;
  this_01 = &this->formats;
  for (k = pos; iVar8 = iVar3 - k, iVar8 != 0 && (int)k <= iVar3; k = k + iVar5) {
    local_48.ptr = (QTextFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    _uStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
    uVar4 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,k,0);
    _uStack_40 = (QTextFormat *)CONCAT44(uStack_3c,uVar4);
    pQVar1 = (this_00->data).field_0.fragments;
    local_48.ptr = (QTextFormatPrivate *)this_00;
    iVar5 = QFragmentMap<QTextFragmentData>::Iterator::position
                      ((Iterator *)&stack0xffffffffffffffb8);
    iVar5 = (iVar5 - k) + pQVar1[uVar4].super_QFragment<1>.size_array[0];
    if (iVar8 < iVar5) {
      iVar5 = iVar8;
    }
    iVar8 = pQVar1[uVar4].format;
    iVar7 = (int)this_01;
    if (mode == MergeFormat) {
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar7);
      QTextFormat::merge((QTextFormat *)local_78,&newFormat->super_QTextFormat);
      iVar7 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_78);
      pQVar1[uVar4].format = iVar7;
      QTextFormat::~QTextFormat((QTextFormat *)local_78);
    }
    else {
      if (mode == SetFormatAndPreserveObjectIndices) {
        QTextFormatCollection::format((QTextFormatCollection *)local_78,iVar7);
        iVar6 = QTextFormat::objectIndex((QTextFormat *)local_78);
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
        if (iVar6 != -1) {
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::QTextFormat((QTextFormat *)local_78,&newFormat->super_QTextFormat);
          QTextFormatCollection::format((QTextFormatCollection *)local_58,iVar7);
          iVar7 = QTextFormat::objectIndex((QTextFormat *)local_58);
          QTextFormat::setObjectIndex((QTextFormat *)local_78,iVar7);
          QTextFormat::~QTextFormat((QTextFormat *)local_58);
          iVar7 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_78);
          pQVar1[uVar4].format = iVar7;
          QTextFormat::~QTextFormat((QTextFormat *)local_78);
          goto LAB_0046088e;
        }
      }
      pQVar1[uVar4].format = local_b8;
    }
LAB_0046088e:
    local_68._4_4_ = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    local_78._4_4_ = iVar8;
    local_78._0_4_ = 0x1010002;
    local_78._8_8_ = (ulong)k << 0x20;
    qStack_60 = 0;
    local_68.blockFormat = iVar5;
    appendUndoItem(this,(QTextUndoCommand *)local_78);
  }
  uVar4 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos - 1,0);
  if (uVar4 != 0) {
    unite(this,uVar4);
  }
  uVar4 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,iVar3,0);
  if (uVar4 != 0) {
    unite(this,uVar4);
  }
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  uVar4 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
  local_78._8_4_ = uVar4;
  _uStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = this;
  uVar4 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,iVar3,0);
  local_48.ptr = (QTextFormatPrivate *)this;
  uStack_40 = uVar4;
  bVar2 = QTextBlock::isValid((QTextBlock *)&stack0xffffffffffffffb8);
  if (bVar2) {
    QTextBlock::next((QTextBlock *)local_58);
    local_48.ptr = (QTextFormatPrivate *)local_58._0_8_;
    uStack_40 = local_58._8_4_;
  }
  while (bVar2 = QTextBlock::isValid((QTextBlock *)local_78), bVar2) {
    if (((QTextFormatPrivate *)local_78._0_8_ == local_48.ptr) && (local_78._8_4_ == uStack_40))
    break;
    QTextBlockData::invalidate
              ((QTextBlockData *)
               ((local_78._8_8_ & 0xffffffff) * 0x48 +
               (long)(((BlockMap *)(local_78._0_8_ + 0x160))->data).field_0.head));
    QTextBlock::next((QTextBlock *)local_58);
    local_78._0_8_ = local_58._0_8_;
    local_78._8_4_ = local_58._8_4_;
  }
  documentChange(this,pos,length);
  endEditBlock(this);
  if ((totally_ordered_wrapper<QFontPrivate_*>)*(QFontPrivate **)(in_FS_OFFSET + 0x28) !=
      local_38.d.ptr) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setCharFormat(int pos, int length, const QTextCharFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormatAndPreserveObjectIndices) {
        QTextCharFormat cleanFormat = newFormat;
        cleanFormat.clearProperty(QTextFormat::ObjectIndex);
        newFormatIdx = formats.indexForFormat(cleanFormat);
    } else if (mode == SetFormat) {
        newFormatIdx = formats.indexForFormat(newFormat);
    }

    if (pos == -1) {
        if (mode == MergeFormat) {
            QTextFormat format = formats.format(initialBlockCharFormatIndex);
            format.merge(newFormat);
            initialBlockCharFormatIndex = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(initialBlockCharFormatIndex).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(initialBlockCharFormatIndex).objectIndex());
            initialBlockCharFormatIndex = formats.indexForFormat(f);
        } else {
            initialBlockCharFormatIndex = newFormatIdx;
        }

        ++pos;
        --length;
    }

    const int startPos = pos;
    const int endPos = pos + length;

    split(startPos);
    split(endPos);

    while (pos < endPos) {
        FragmentMap::Iterator it = fragments.find(pos);
        Q_ASSERT(!it.atEnd());

        QTextFragmentData *fragment = it.value();

        Q_ASSERT(formats.format(fragment->format).type() == QTextFormat::CharFormat);

        int offset = pos - it.position();
        int length = qMin(endPos - pos, int(fragment->size_array[0] - offset));
        int oldFormat = fragment->format;

        if (mode == MergeFormat) {
            QTextFormat format = formats.format(fragment->format);
            format.merge(newFormat);
            fragment->format = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(oldFormat).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(oldFormat).objectIndex());
            fragment->format = formats.indexForFormat(f);
        } else {
            fragment->format = newFormatIdx;
        }

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::CharFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, pos, length, 0);
        appendUndoItem(c);

        pos += length;
        Q_ASSERT(q20::cmp_equal(pos, (it.position() + fragment->size_array[0])) || pos >= endPos);
    }

    int n = fragments.findNode(startPos - 1);
    if (n)
        unite(n);

    n = fragments.findNode(endPos);
    if (n)
        unite(n);

    QTextBlock blockIt = blocksFind(startPos);
    QTextBlock endIt = blocksFind(endPos);
    if (endIt.isValid())
        endIt = endIt.next();
    for (; blockIt.isValid() && blockIt != endIt; blockIt = blockIt.next())
        QTextDocumentPrivate::block(blockIt)->invalidate();

    documentChange(startPos, length);

    endEditBlock();
}